

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_freeCCtxPool(ZSTDMT_CCtxPool *pool)

{
  int local_14;
  int cid;
  ZSTDMT_CCtxPool *pool_local;
  
  for (local_14 = 0; local_14 < pool->totalCCtx; local_14 = local_14 + 1) {
    ZSTD_freeCCtx(pool->cctx[local_14]);
  }
  pthread_mutex_destroy((pthread_mutex_t *)pool);
  ZSTD_free(pool,pool->cMem);
  return;
}

Assistant:

static void ZSTDMT_freeCCtxPool(ZSTDMT_CCtxPool* pool)
{
    int cid;
    for (cid=0; cid<pool->totalCCtx; cid++)
        ZSTD_freeCCtx(pool->cctx[cid]);  /* note : compatible with free on NULL */
    ZSTD_pthread_mutex_destroy(&pool->poolMutex);
    ZSTD_free(pool, pool->cMem);
}